

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rhombicCode.cpp
# Opt level: O3

void __thiscall RhombicCode::sweep(RhombicCode *this,string *direction,bool greedy)

{
  _Rb_tree_header *p_Var1;
  set<int,_std::less<int>,_std::allocator<int>_> *this_00;
  _Rb_tree_header *p_Var2;
  char cVar3;
  uint vertexIndex;
  int iVar4;
  uint *puVar5;
  pointer pvVar6;
  int *piVar7;
  pointer pcVar8;
  bool bVar9;
  int iVar10;
  _Base_ptr p_Var11;
  int *piVar12;
  length_error *this_01;
  invalid_argument *piVar13;
  string *sweepDirection;
  int iVar14;
  undefined7 in_register_00000011;
  const_iterator __position;
  _Base_ptr p_Var15;
  uint *puVar16;
  long *plVar17;
  long lVar18;
  cartesian4 cVar19;
  vstr sweepEdges;
  vstr edgeDirections;
  undefined1 local_b8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  undefined1 local_88 [16];
  long *local_78 [2];
  long local_68 [2];
  vstr local_58;
  undefined4 local_34;
  
  local_34 = (undefined4)CONCAT71(in_register_00000011,greedy);
  Code::clearFlipBits(&this->super_Code);
  local_58.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar10 = std::__cxx11::string::compare((char *)direction);
  if (iVar10 == 0) {
    local_b8._0_8_ = local_b8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"xy","");
    local_98._M_allocated_capacity = (size_type)local_88;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"yz","");
    plVar17 = local_68;
    local_78[0] = plVar17;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"xz","");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_assign_aux<std::__cxx11::string_const*>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_58,
               local_b8,&local_58);
    lVar18 = -0x60;
    do {
      if (plVar17 != (long *)plVar17[-2]) {
        operator_delete((long *)plVar17[-2],*plVar17 + 1);
      }
      plVar17 = plVar17 + -4;
      lVar18 = lVar18 + 0x20;
    } while (lVar18 != 0);
  }
  else {
    iVar10 = std::__cxx11::string::compare((char *)direction);
    if (iVar10 == 0) {
      local_b8._0_8_ = local_b8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"xyz","");
      local_98._M_allocated_capacity = (size_type)local_88;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"-xz","");
      plVar17 = local_68;
      local_78[0] = plVar17;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"-yz","");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      _M_assign_aux<std::__cxx11::string_const*>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_58,
                 local_b8,&local_58);
      lVar18 = -0x60;
      do {
        if (plVar17 != (long *)plVar17[-2]) {
          operator_delete((long *)plVar17[-2],*plVar17 + 1);
        }
        plVar17 = plVar17 + -4;
        lVar18 = lVar18 + 0x20;
      } while (lVar18 != 0);
    }
    else {
      iVar10 = std::__cxx11::string::compare((char *)direction);
      if (iVar10 == 0) {
        local_b8._0_8_ = local_b8 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"xyz","");
        local_98._M_allocated_capacity = (size_type)local_88;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"-xy","");
        plVar17 = local_68;
        local_78[0] = plVar17;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"-yz","");
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        _M_assign_aux<std::__cxx11::string_const*>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_58,
                   local_b8,&local_58);
        lVar18 = -0x60;
        do {
          if (plVar17 != (long *)plVar17[-2]) {
            operator_delete((long *)plVar17[-2],*plVar17 + 1);
          }
          plVar17 = plVar17 + -4;
          lVar18 = lVar18 + 0x20;
        } while (lVar18 != 0);
      }
      else {
        iVar10 = std::__cxx11::string::compare((char *)direction);
        if (iVar10 == 0) {
          local_b8._0_8_ = local_b8 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"xyz","");
          local_98._M_allocated_capacity = (size_type)local_88;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"-xy","");
          plVar17 = local_68;
          local_78[0] = plVar17;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"-xz","");
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          _M_assign_aux<std::__cxx11::string_const*>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_58,
                     local_b8,&local_58);
          lVar18 = -0x60;
          do {
            if (plVar17 != (long *)plVar17[-2]) {
              operator_delete((long *)plVar17[-2],*plVar17 + 1);
            }
            plVar17 = plVar17 + -4;
            lVar18 = lVar18 + 0x20;
          } while (lVar18 != 0);
        }
        else {
          iVar10 = std::__cxx11::string::compare((char *)direction);
          if (iVar10 == 0) {
            local_b8._0_8_ = local_b8 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"-xy","");
            local_98._M_allocated_capacity = (size_type)local_88;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"-yz","");
            plVar17 = local_68;
            local_78[0] = plVar17;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"-xz","");
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            _M_assign_aux<std::__cxx11::string_const*>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &local_58,local_b8,&local_58);
            lVar18 = -0x60;
            do {
              if (plVar17 != (long *)plVar17[-2]) {
                operator_delete((long *)plVar17[-2],*plVar17 + 1);
              }
              plVar17 = plVar17 + -4;
              lVar18 = lVar18 + 0x20;
            } while (lVar18 != 0);
          }
          else {
            iVar10 = std::__cxx11::string::compare((char *)direction);
            if (iVar10 == 0) {
              local_b8._0_8_ = local_b8 + 0x10;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"-xyz","");
              local_98._M_allocated_capacity = (size_type)local_88;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"xz","");
              plVar17 = local_68;
              local_78[0] = plVar17;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"yz","");
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              _M_assign_aux<std::__cxx11::string_const*>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         &local_58,local_b8,&local_58);
              lVar18 = -0x60;
              do {
                if (plVar17 != (long *)plVar17[-2]) {
                  operator_delete((long *)plVar17[-2],*plVar17 + 1);
                }
                plVar17 = plVar17 + -4;
                lVar18 = lVar18 + 0x20;
              } while (lVar18 != 0);
            }
            else {
              iVar10 = std::__cxx11::string::compare((char *)direction);
              if (iVar10 == 0) {
                local_b8._0_8_ = local_b8 + 0x10;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"-xyz","");
                local_98._M_allocated_capacity = (size_type)local_88;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"xy","");
                plVar17 = local_68;
                local_78[0] = plVar17;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"yz","");
                std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                _M_assign_aux<std::__cxx11::string_const*>
                          ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                           &local_58,local_b8,&local_58);
                lVar18 = -0x60;
                do {
                  if (plVar17 != (long *)plVar17[-2]) {
                    operator_delete((long *)plVar17[-2],*plVar17 + 1);
                  }
                  plVar17 = plVar17 + -4;
                  lVar18 = lVar18 + 0x20;
                } while (lVar18 != 0);
              }
              else {
                iVar10 = std::__cxx11::string::compare((char *)direction);
                if (iVar10 != 0) {
                  piVar13 = (invalid_argument *)__cxa_allocate_exception(0x10);
                  std::invalid_argument::invalid_argument(piVar13,"Invalid sweep direction.");
                  __cxa_throw(piVar13,&std::invalid_argument::typeinfo,
                              std::invalid_argument::~invalid_argument);
                }
                local_b8._0_8_ = local_b8 + 0x10;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"-xyz","");
                local_98._M_allocated_capacity = (size_type)local_88;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"xy","");
                plVar17 = local_68;
                local_78[0] = plVar17;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"xz","");
                std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                _M_assign_aux<std::__cxx11::string_const*>
                          ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                           &local_58,local_b8,&local_58);
                lVar18 = -0x60;
                do {
                  if (plVar17 != (long *)plVar17[-2]) {
                    operator_delete((long *)plVar17[-2],*plVar17 + 1);
                  }
                  plVar17 = plVar17 + -4;
                  lVar18 = lVar18 + 0x20;
                } while (lVar18 != 0);
              }
            }
          }
        }
      }
    }
  }
  puVar5 = (uint *)(this->super_Code).sweepIndices.super__Vector_base<int,_std::allocator<int>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
  for (puVar16 = (uint *)(this->super_Code).sweepIndices.
                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start; puVar16 != puVar5; puVar16 = puVar16 + 1)
  {
    vertexIndex = *puVar16;
    if (((char)local_34 != '\0') ||
       (bVar9 = Code::checkExtremalVertex(&this->super_Code,vertexIndex,direction), bVar9)) {
      (*(this->super_Code)._vptr_Code[3])(local_b8,this,(ulong)vertexIndex,direction);
      if (0x80 < (ulong)(local_b8._8_8_ - local_b8._0_8_)) {
        this_01 = (length_error *)__cxa_allocate_exception(0x10);
        std::length_error::length_error
                  (this_01,"More than four up-edges found for a rhombic lattice vertex.");
        __cxa_throw(this_01,&std::length_error::typeinfo,std::length_error::~length_error);
      }
      if (local_b8._8_8_ != local_b8._0_8_) {
        cVar19 = Lattice::indexToCoordinate
                           ((this->super_Code).lattice._M_t.
                            super___uniq_ptr_impl<Lattice,_std::default_delete<Lattice>_>._M_t.
                            super__Tuple_impl<0UL,_Lattice_*,_std::default_delete<Lattice>_>.
                            super__Head_base<0UL,_Lattice_*,_false>._M_head_impl,vertexIndex);
        if ((local_b8._8_8_ - local_b8._0_8_ != 0x20) || ((this->super_Code).boundaries != false)) {
          sweepDirection = (string *)(cVar19._8_8_ >> 0x20);
          if (sweepDirection == (string *)0x0) {
            if ((cVar19.z + cVar19.x + cVar19.y) % 2 != this->latticeParity) {
              piVar13 = (invalid_argument *)__cxa_allocate_exception(0x10);
              std::invalid_argument::invalid_argument
                        (piVar13,"Vertex not present in lattice has up-edges.");
              __cxa_throw(piVar13,&std::invalid_argument::typeinfo,
                          std::invalid_argument::~invalid_argument);
            }
            if ((this->super_Code).boundaries == true) {
              sweepFullVertexBoundary(this,vertexIndex,(vstr *)local_b8,direction,&local_58);
            }
            else {
              sweepFullVertex(this,vertexIndex,(vstr *)local_b8,direction,&local_58);
            }
          }
          else if ((this->super_Code).boundaries == true) {
            sweepHalfVertexBoundary(this,vertexIndex,(vstr *)local_b8,direction,&local_58);
          }
          else {
            sweepHalfVertex(this,vertexIndex,(vstr *)local_b8,sweepDirection,&local_58);
          }
        }
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_b8);
    }
  }
  local_b8._0_8_ = local_b8._0_8_ & 0xffffffff00000000;
  iVar10 = *(int *)&(this->super_Code).flipBits.
                    super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                    super__Vector_impl_data._M_finish -
           *(int *)&(this->super_Code).flipBits.
                    super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                    super__Vector_impl_data._M_start;
  if (0 < iVar10) {
    this_00 = &(this->super_Code).error;
    p_Var2 = &(this->super_Code).error._M_t._M_impl.super__Rb_tree_header;
    p_Var1 = &(this->super_Code).syndromeIndices._M_t._M_impl.super__Rb_tree_header;
    iVar14 = 0;
    do {
      if ((this->super_Code).flipBits.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
          _M_impl.super__Vector_impl_data._M_start[iVar14] != '\0') {
        p_Var11 = (this->super_Code).error._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        __position._M_node = &p_Var2->_M_header;
        if (p_Var11 == (_Base_ptr)0x0) {
LAB_00112612:
          std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
          _M_insert_unique<int_const&>
                    ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                     this_00,(int *)local_b8);
        }
        else {
          do {
            if (iVar14 <= (int)p_Var11[1]._M_color) {
              __position._M_node = p_Var11;
            }
            p_Var11 = (&p_Var11->_M_left)[(int)p_Var11[1]._M_color < iVar14];
          } while (p_Var11 != (_Base_ptr)0x0);
          if (((_Rb_tree_header *)__position._M_node == p_Var2) ||
             (iVar14 < (int)__position._M_node[1]._M_color)) goto LAB_00112612;
          std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
          erase_abi_cxx11_((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>
                            *)this_00,__position);
        }
        iVar14 = local_b8._0_4_;
        if (1 < (this->super_Code).sweepRate) {
          pvVar6 = (this->super_Code).faceToEdges.
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          piVar7 = pvVar6[(int)local_b8._0_4_].super__Vector_base<int,_std::allocator<int>_>._M_impl
                   .super__Vector_impl_data._M_finish;
          for (piVar12 = pvVar6[(int)local_b8._0_4_].super__Vector_base<int,_std::allocator<int>_>.
                         _M_impl.super__Vector_impl_data._M_start; piVar12 != piVar7;
              piVar12 = piVar12 + 1) {
            iVar4 = *piVar12;
            if ((this->super_Code).boundaries == true) {
              p_Var11 = (this->super_Code).syndromeIndices._M_t._M_impl.super__Rb_tree_header.
                        _M_header._M_parent;
              p_Var15 = &p_Var1->_M_header;
              if (p_Var11 != (_Base_ptr)0x0) {
                do {
                  if (iVar4 <= (int)*(size_t *)(p_Var11 + 1)) {
                    p_Var15 = p_Var11;
                  }
                  p_Var11 = (&p_Var11->_M_left)[(int)*(size_t *)(p_Var11 + 1) < iVar4];
                } while (p_Var11 != (_Base_ptr)0x0);
                if (((_Rb_tree_header *)p_Var15 != p_Var1) &&
                   ((int)((_Rb_tree_header *)p_Var15)->_M_node_count <= iVar4)) goto LAB_00112683;
              }
            }
            else {
LAB_00112683:
              pcVar8 = (this->super_Code).syndrome.
                       super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                       super__Vector_impl_data._M_start;
              cVar3 = pcVar8[iVar4];
              pcVar8[iVar4] =
                   cVar3 + ((byte)((char)(((int)cVar3 + 1U & 0xffff) >> 0xf) + cVar3 + 1U) >> 1) *
                           -2 + '\x01';
            }
          }
        }
      }
      iVar14 = iVar14 + 1;
      local_b8._0_4_ = iVar14;
    } while (iVar14 < iVar10);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_58);
  return;
}

Assistant:

void RhombicCode::sweep(const std::string &direction, bool greedy)
{
    clearFlipBits();
    vstr edgeDirections;
    if (direction == "xyz")
    {
        edgeDirections = {"xy", "yz", "xz"};
    }
    else if (direction == "xy")
    {
        edgeDirections = {"xyz", "-xz", "-yz"};
    }
    else if (direction == "xz")
    {
        edgeDirections = {"xyz", "-xy", "-yz"};
    }
    else if (direction == "yz")
    {
        edgeDirections = {"xyz", "-xy", "-xz"};
    }
    else if (direction == "-xyz")
    {
        edgeDirections = {"-xy", "-yz", "-xz"};
    }
    else if (direction == "-xy")
    {
        edgeDirections = {"-xyz", "xz", "yz"};
    }
    else if (direction == "-xz")
    {
        edgeDirections = {"-xyz", "xy", "yz"};
    }
    else if (direction == "-yz")
    {
        edgeDirections = {"-xyz", "xy", "xz"};
    }
    else
    {
        throw std::invalid_argument("Invalid sweep direction.");
    }
    // for (int vertexIndex = 0; vertexIndex < 2 * pow(l, 3); ++vertexIndex)
    for (auto const vertexIndex : sweepIndices)
    {
        if (!greedy)
        {
            if (!checkExtremalVertex(vertexIndex, direction))
            {
                continue;
            }
        }
        // std::cout << "Trying to find sweep edges... ";
        vstr sweepEdges = findSweepEdges(vertexIndex, direction);
        // if (sweepEdges.size() > 0)
        // {
        //     std::cerr << "Vertex = " << lattice->indexToCoordinate(vertexIndex) << std::endl;
        //     for (auto &e : sweepEdges)
        //     {
        //         std::cerr << e << std::endl;
        //     }
        // }
        // std::cout << "FOUND." << std::endl;
        if (sweepEdges.size() > 4)
        {
            throw std::length_error("More than four up-edges found for a rhombic lattice vertex.");
        }
        if (sweepEdges.size() == 0)
        {
            continue;
        }
        cartesian4 coordinate = lattice->indexToCoordinate(vertexIndex);
        // if (sweepEdges.size() == 1 && (!boundaries || coordinate.w == 0))
        if (sweepEdges.size() == 1 && !boundaries)
        {
            continue;
        }
        if (coordinate.w == 0)
        {
            if ((coordinate.x + coordinate.y + coordinate.z) % 2 == latticeParity)
            {
                if (boundaries)
                {
                    sweepFullVertexBoundary(vertexIndex, sweepEdges, direction, edgeDirections);
                }
                else
                {
                    sweepFullVertex(vertexIndex, sweepEdges, direction, edgeDirections);
                }
            }
            else
            {
                throw std::invalid_argument("Vertex not present in lattice has up-edges.");
            }
        }
        else
        {
            if (boundaries)
            {
                sweepHalfVertexBoundary(vertexIndex, sweepEdges, direction, edgeDirections);
            }
            else
            {
                sweepHalfVertex(vertexIndex, sweepEdges, direction, edgeDirections);
            }
        }
    }
    for (int i = 0, imax = flipBits.size(); i < imax; ++i)
    {
        if (flipBits[i])
        {
            auto it = error.find(i);
            if (it != error.end())
            {
                error.erase(it);
            }
            else
            {
                error.insert(i);
            }
            if (sweepRate > 1)
            {
                for (const int edge : faceToEdges[i])
                {
                    // std::cerr << edge << std::endl;
                    if (boundaries)
                    {
                        auto it2 = syndromeIndices.find(edge);
                        if (it2 == syndromeIndices.end())
                        {
                            continue;
                        }
                    }
                    syndrome[edge] = (syndrome[edge] + 1) % 2;
                }
            }
        }
    }
}